

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O0

int push0_set_send_buf_len(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int local_3c;
  int rv;
  int val;
  push0_sock *s;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _rv = (nni_lmq *)arg;
  s._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  arg_local._4_4_ = nni_copyin_int(&local_3c,buf,sz,0,0x2000,t);
  if (arg_local._4_4_ == 0) {
    nni_mtx_lock((nni_mtx *)(_rv[1].lmq_buf + 1));
    iVar2 = nni_lmq_resize(_rv,(long)local_3c);
    _Var1 = nni_lmq_full(_rv);
    if (_Var1) {
      iVar3 = nni_list_empty((nni_list *)&_rv[1].lmq_len);
      if (iVar3 != 0) {
        nni_pollable_clear((nni_pollable *)&_rv[1].lmq_msgs);
      }
    }
    else {
      nni_pollable_raise((nni_pollable *)&_rv[1].lmq_msgs);
    }
    nni_mtx_unlock((nni_mtx *)(_rv[1].lmq_buf + 1));
    arg_local._4_4_ = iVar2;
  }
  return arg_local._4_4_;
}

Assistant:

static int
push0_set_send_buf_len(void *arg, const void *buf, size_t sz, nni_type t)
{
	push0_sock *s = arg;
	int         val;
	int         rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 0, 8192, t)) != 0) {
		return (rv);
	}
	nni_mtx_lock(&s->m);
	rv = nni_lmq_resize(&s->wq, (size_t) val);
	// Changing the size of the queue can affect our readiness.
	if (!nni_lmq_full(&s->wq)) {
		nni_pollable_raise(&s->writable);
	} else if (nni_list_empty(&s->pl)) {
		nni_pollable_clear(&s->writable);
	}
	nni_mtx_unlock(&s->m);
	return (rv);
}